

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O3

void nni_aio_completions_run(nni_aio_completions *clp)

{
  nni_aio *aio;
  nni_aio *pnVar1;
  
  aio = (nni_aio *)*clp;
  *clp = (nni_aio_completions)0x0;
  while (aio != (nni_aio *)0x0) {
    pnVar1 = (nni_aio *)(aio->a_reap_node).rn_next;
    (aio->a_reap_node).rn_next = (nni_reap_node *)0x0;
    nni_aio_finish_impl(aio,aio->a_result,aio->a_count,(nni_msg *)0x0,true);
    aio = pnVar1;
  }
  return;
}

Assistant:

void
nni_aio_completions_run(nni_aio_completions *clp)
{
	nni_aio *aio;
	nni_aio *cl = *clp;
	*clp        = NULL;

	while ((aio = cl) != NULL) {
		cl                       = (void *) aio->a_reap_node.rn_next;
		aio->a_reap_node.rn_next = NULL;
		nni_aio_finish_sync(aio, aio->a_result, aio->a_count);
	}
}